

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FrameTranslator.cpp
# Opt level: O0

Expression * __thiscall IRT::FrameTranslator::GetField(FrameTranslator *this,string *name)

{
  bool bVar1;
  Expression *lhs;
  bool bVar2;
  __type _Var3;
  int iVar4;
  uint uVar5;
  mapped_type *this_00;
  reference ppAVar6;
  undefined4 extraout_var;
  ClassStorage *pCVar7;
  __shared_ptr_access<PrimitiveObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  element_type *peVar8;
  MemExpression *this_02;
  BinopExpression *this_03;
  ConstExpression *this_04;
  runtime_error *this_05;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  string local_180;
  Symbol local_160;
  unordered_map<Symbol,_std::shared_ptr<PrimitiveObject>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<PrimitiveObject>_>_>_>
  local_140;
  string local_108;
  reference local_e8;
  Symbol *field;
  iterator __end1;
  iterator __begin1;
  vector<Symbol,_std::allocator<Symbol>_> *__range1;
  size_t offset;
  undefined1 local_b8 [7];
  bool is_found;
  Symbol local_98;
  undefined1 local_78 [8];
  vector<Symbol,_std::allocator<Symbol>_> field_names;
  Expression *field_ptr;
  allocator<char> local_41;
  key_type local_40;
  Expression *local_20;
  Expression *this_ptr;
  string *name_local;
  FrameTranslator *this_local;
  
  this_ptr = (Expression *)name;
  name_local = &this->return_address_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"this",&local_41);
  this_00 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<IRT::Address_*,_std::deque<IRT::Address_*,_std::allocator<IRT::Address_*>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<IRT::Address_*,_std::deque<IRT::Address_*,_std::allocator<IRT::Address_*>_>_>_>_>_>
            ::operator[](&this->addresses_,&local_40);
  ppAVar6 = std::stack<IRT::Address_*,_std::deque<IRT::Address_*,_std::allocator<IRT::Address_*>_>_>
            ::top(this_00);
  iVar4 = (*(*ppAVar6)->_vptr_Address[2])();
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  local_20 = (Expression *)CONCAT44(extraout_var,iVar4);
  pCVar7 = ClassStorage::GetInstance();
  std::__cxx11::string::string((string *)local_b8,(string *)&this->class_name_);
  Symbol::Symbol(&local_98,(string *)local_b8);
  ClassStorage::GetFieldsNames((vector<Symbol,_std::allocator<Symbol>_> *)local_78,pCVar7,&local_98)
  ;
  Symbol::~Symbol(&local_98);
  std::__cxx11::string::~string((string *)local_b8);
  bVar1 = false;
  __range1 = (vector<Symbol,_std::allocator<Symbol>_> *)0x0;
  __end1 = std::vector<Symbol,_std::allocator<Symbol>_>::begin
                     ((vector<Symbol,_std::allocator<Symbol>_> *)local_78);
  field = (Symbol *)
          std::vector<Symbol,_std::allocator<Symbol>_>::end
                    ((vector<Symbol,_std::allocator<Symbol>_> *)local_78);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Symbol_*,_std::vector<Symbol,_std::allocator<Symbol>_>_>
                                *)&field);
    if (!bVar2) {
LAB_0015a70c:
      if (!bVar1) {
        this_05 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_1a0,"Undeclared field: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_ptr
                      );
        std::runtime_error::runtime_error(this_05,(string *)&local_1a0);
        __cxa_throw(this_05,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      this_02 = (MemExpression *)operator_new(0x10);
      this_03 = (BinopExpression *)operator_new(0x20);
      lhs = local_20;
      this_04 = (ConstExpression *)operator_new(0x10);
      ConstExpression::ConstExpression(this_04,(int)__range1);
      BinopExpression::BinopExpression(this_03,PLUS,lhs,(Expression *)this_04);
      MemExpression::MemExpression(this_02,(Expression *)this_03);
      field_names.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)this_02;
      std::vector<Symbol,_std::allocator<Symbol>_>::~vector
                ((vector<Symbol,_std::allocator<Symbol>_> *)local_78);
      return &this_02->super_Expression;
    }
    local_e8 = __gnu_cxx::__normal_iterator<Symbol_*,_std::vector<Symbol,_std::allocator<Symbol>_>_>
               ::operator*(&__end1);
    Symbol::GetName_abi_cxx11_(&local_108,local_e8);
    _Var3 = std::operator==(&local_108,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            this_ptr);
    std::__cxx11::string::~string((string *)&local_108);
    if (_Var3) {
      bVar1 = true;
      goto LAB_0015a70c;
    }
    pCVar7 = ClassStorage::GetInstance();
    std::__cxx11::string::string((string *)&local_180,(string *)&this->class_name_);
    Symbol::Symbol(&local_160,&local_180);
    ClassStorage::GetFields(&local_140,pCVar7,&local_160);
    this_01 = (__shared_ptr_access<PrimitiveObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              std::
              unordered_map<Symbol,_std::shared_ptr<PrimitiveObject>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<PrimitiveObject>_>_>_>
              ::operator[](&local_140,local_e8);
    peVar8 = std::__shared_ptr_access<PrimitiveObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this_01);
    uVar5 = (*(peVar8->super_Object)._vptr_Object[3])();
    __range1 = (vector<Symbol,_std::allocator<Symbol>_> *)
               ((long)&(__range1->super__Vector_base<Symbol,_std::allocator<Symbol>_>)._M_impl.
                       super__Vector_impl_data._M_start + (ulong)uVar5);
    std::
    unordered_map<Symbol,_std::shared_ptr<PrimitiveObject>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<PrimitiveObject>_>_>_>
    ::~unordered_map(&local_140);
    Symbol::~Symbol(&local_160);
    std::__cxx11::string::~string((string *)&local_180);
    __gnu_cxx::__normal_iterator<Symbol_*,_std::vector<Symbol,_std::allocator<Symbol>_>_>::
    operator++(&__end1);
  } while( true );
}

Assistant:

IRT::Expression* FrameTranslator::GetField(const std::string& name) {
  IRT::Expression* this_ptr = addresses_["this"].top()->ToExpression();
  IRT::Expression* field_ptr;

  auto field_names =
      ClassStorage::GetInstance().GetFieldsNames(Symbol(class_name_));
  bool is_found = false;
  size_t offset = 0;

  for (auto&& field : field_names) {
    if (field.GetName() == name) {
      is_found = true;
      break;
    }
    offset += ClassStorage::GetInstance()
                  .GetFields(Symbol(class_name_))[field]
                  ->GetSize();
  }
  if (is_found) {
    field_ptr = new MemExpression(new BinopExpression(
        BinaryOperatorType::PLUS, this_ptr, new ConstExpression(offset)));
  } else {
    throw std::runtime_error("Undeclared field: " + name);
  }

  return field_ptr;
}